

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_doomweaps.cpp
# Opt level: O2

int AF_A_FirePistol(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  DObject *this;
  AWeapon *this_00;
  bool bVar2;
  void *pvVar3;
  FState *state;
  PClassActor *pufftype;
  player_t *ppVar4;
  AActor *ent;
  char *__assertion;
  FSoundID local_30;
  FName local_2c;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_0051fd33;
  }
  if ((param->field_0).field_3.Type != '\x03') goto LAB_0051fd23;
  ent = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (ent == (AActor *)0x0) goto LAB_0051fb98;
    bVar2 = DObject::IsKindOf((DObject *)ent,AActor::RegistrationInfo.MyClass);
    if (!bVar2) {
      __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_0051fd33;
    }
  }
  else {
    if (ent != (AActor *)0x0) goto LAB_0051fd23;
LAB_0051fb98:
    ent = (AActor *)0x0;
  }
  if (numparam != 1) {
    VVar1 = param[1].field_0.field_3.Type;
    if (VVar1 != 0xff) {
      if (VVar1 != '\x03') {
LAB_0051fd23:
        __assertion = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
        ;
        goto LAB_0051fd33;
      }
      this = (DObject *)param[1].field_0.field_1.a;
      if (param[1].field_0.field_1.atag == 1) {
        if ((this != (DObject *)0x0) &&
           (bVar2 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass), !bVar2)) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0051fd33;
        }
      }
      else if (this != (DObject *)0x0) goto LAB_0051fd23;
    }
    if ((2 < (uint)numparam) && (VVar1 = param[2].field_0.field_3.Type, VVar1 != 0xff)) {
      if (VVar1 == '\x03') {
        pvVar3 = param[2].field_0.field_1.a;
        if (param[2].field_0.field_1.atag == 8) goto LAB_0051fc1c;
        if (pvVar3 == (void *)0x0) goto LAB_0051fc1a;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
LAB_0051fd33:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_doomweaps.cpp"
                    ,0x48,"int AF_A_FirePistol(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
  }
LAB_0051fc1a:
  pvVar3 = (void *)0x0;
LAB_0051fc1c:
  ppVar4 = ent->player;
  if (ppVar4 == (player_t *)0x0) {
    bVar2 = true;
  }
  else {
    this_00 = ppVar4->ReadyWeapon;
    if ((pvVar3 != (void *)0x0 && this_00 != (AWeapon *)0x0) && (*(int *)((long)pvVar3 + 8) == 1)) {
      bVar2 = AWeapon::DepleteAmmo(this_00,this_00->bAltFire,true,1);
      if (!bVar2) {
        return 0;
      }
      ppVar4 = ent->player;
      local_2c.Index = 0xa3;
      state = AActor::FindState((AActor *)this_00,&local_2c);
      P_SetPsprite(ppVar4,PSP_FLASH,state,true);
      ppVar4 = ent->player;
    }
    APlayerPawn::PlayAttacking2(ppVar4->mo);
    bVar2 = ent->player->refire == 0;
  }
  local_30.ID = S_FindSound("weapons/pistol");
  S_Sound(ent,1,&local_30,1.0,1.0);
  pufftype = PClass::FindActor(NAME_BulletPuff);
  P_BulletSlope((AActor *)&stack0xffffffffffffffd8,(FTranslatedLineTarget *)ent,0);
  P_GunShot(ent,bVar2,pufftype,(DAngle *)&stack0xffffffffffffffd8);
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FirePistol)
{
	PARAM_ACTION_PROLOGUE;

	bool accurate;

	if (self->player != nullptr)
	{
		AWeapon *weapon = self->player->ReadyWeapon;
		if (weapon != nullptr && ACTION_CALL_FROM_PSPRITE())
		{
			if (!weapon->DepleteAmmo (weapon->bAltFire, true, 1))
				return 0;

			P_SetPsprite(self->player, PSP_FLASH, weapon->FindState(NAME_Flash), true);
		}
		self->player->mo->PlayAttacking2 ();

		accurate = !self->player->refire;
	}
	else
	{
		accurate = true;
	}

	S_Sound (self, CHAN_WEAPON, "weapons/pistol", 1, ATTN_NORM);

	P_GunShot (self, accurate, PClass::FindActor(NAME_BulletPuff), P_BulletSlope (self));
	return 0;
}